

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void jumpscopeerror(LexState *ls,Labeldesc *gt)

{
  TString *pTVar1;
  Vardesc *pVVar2;
  char *msg_00;
  char **local_50;
  char **local_38;
  char *msg;
  char *varname;
  TString *tsname;
  Labeldesc *gt_local;
  LexState *ls_local;
  
  pVVar2 = getlocalvardesc(ls->fs,(uint)gt->nactvar);
  pTVar1 = (pVVar2->vd).name;
  if (pTVar1->shrlen < '\0') {
    local_38 = (char **)pTVar1->contents;
  }
  else {
    local_38 = &pTVar1->contents;
  }
  if (gt->name->shrlen < '\0') {
    local_50 = (char **)gt->name->contents;
  }
  else {
    local_50 = &gt->name->contents;
  }
  msg_00 = luaO_pushfstring(ls->L,"<goto %s> at line %d jumps into the scope of local \'%s\'",
                            local_50,(ulong)(uint)gt->line,local_38);
  luaK_semerror(ls,msg_00);
}

Assistant:

static l_noret jumpscopeerror (LexState *ls, Labeldesc *gt) {
  TString *tsname = getlocalvardesc(ls->fs, gt->nactvar)->vd.name;
  const char *varname = getstr(tsname);
  const char *msg = "<goto %s> at line %d jumps into the scope of local '%s'";
  msg = luaO_pushfstring(ls->L, msg, getstr(gt->name), gt->line, varname);
  luaK_semerror(ls, msg);  /* raise the error */
}